

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O3

vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_> *
__thiscall
TestChain100Setup::PopulateMempool
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *__return_storage_ptr__,TestChain100Setup *this,FastRandomContext *det_rand,
          size_t num_transactions,bool submit)

{
  ulong uVar1;
  pointer psVar2;
  element_type *peVar3;
  CTxMemPool *this_00;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  uint64_t uVar10;
  pair<COutPoint,_long> *ppVar11;
  ulong uVar12;
  _Elt_pointer ppVar13;
  uchar *puVar14;
  long lVar15;
  ulong uVar16;
  _Elt_pointer ppVar17;
  long lVar18;
  pointer psVar19;
  long in_FS_OFFSET;
  bool bVar20;
  CTransactionRef ptx;
  CAmount amount_per_output;
  CMutableTransaction mtx;
  deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_> unspent_prevouts;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  value_type local_228;
  ulong local_218;
  undefined1 local_210 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> local_1f8;
  _Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_> local_1d8;
  unique_lock<std::recursive_mutex> local_188;
  unique_lock<std::recursive_mutex> local_178;
  undefined1 local_168 [24];
  _Rb_tree_node_base _Stack_150;
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  local_128 [4];
  undefined1 local_58 [28];
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>::
  _M_initialize_map(&local_1d8,0);
  psVar19 = (this->m_coinbase_txns).
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->m_coinbase_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar19 != psVar2) {
    do {
      peVar3 = (psVar19->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_168._16_8_ =
           *(undefined8 *)
            ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      _Stack_150._0_8_ =
           *(undefined8 *)
            ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      local_168._0_8_ =
           *(undefined8 *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      local_168._8_8_ =
           *(undefined8 *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
      ;
      _Stack_150._M_parent._0_4_ = 0;
      _Stack_150._M_left =
           (_Base_ptr)
           ((peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start)->nValue;
      std::deque<std::pair<COutPoint,long>,std::allocator<std::pair<COutPoint,long>>>::
      emplace_back<std::pair<COutPoint,long>>
                ((deque<std::pair<COutPoint,long>,std::allocator<std::pair<COutPoint,long>>> *)
                 &local_1d8,(pair<COutPoint,_long> *)local_168);
      psVar19 = psVar19 + 1;
    } while (psVar19 != psVar2);
  }
  if (num_transactions != 0) {
    do {
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_210);
      do {
        uVar8 = RandomMixin<FastRandomContext>::randbits
                          (&det_rand->super_RandomMixin<FastRandomContext>,5);
      } while (0x17 < uVar8);
      lVar18 = uVar8 + 1;
      lVar15 = 0;
      do {
        ppVar17 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        local_168[0x10] = '\0';
        local_168[0x11] = '\0';
        local_168[0x12] = '\0';
        local_168[0x13] = '\0';
        local_168[0x14] = '\0';
        local_168[0x15] = '\0';
        local_168[0x16] = '\0';
        local_168[0x17] = '\0';
        _Stack_150._M_color = _S_red;
        _Stack_150._4_4_ = 0;
        local_168._0_8_ = (char *)0x0;
        local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint_const&,CScript>
                  ((vector<CTxIn,std::allocator<CTxIn>> *)local_210,
                   &(local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur)->first,
                   (CScript *)local_168);
        if (0x1c < (uint)_Stack_150._4_4_) {
          free((void *)local_168._0_8_);
        }
        lVar15 = lVar15 + ppVar17->second;
        if (local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_start._M_first,0x1e0);
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_last =
               local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur + 10;
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_first =
               local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_node =
               local_1d8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        lVar18 = lVar18 + -1;
      } while (lVar18 != 0);
      do {
        uVar8 = RandomMixin<FastRandomContext>::randbits
                          (&det_rand->super_RandomMixin<FastRandomContext>,5);
      } while (0x17 < uVar8);
      do {
        uVar9 = RandomMixin<FastRandomContext>::randbits
                          (&det_rand->super_RandomMixin<FastRandomContext>,5);
      } while (0x1d < uVar9);
      uVar1 = uVar8 + 1;
      local_218 = (uVar9 * -100 + lVar15) / uVar1;
      uVar16 = 0;
      do {
        local_58._16_4_ = 0;
        local_58._20_4_ = 0;
        stack0xffffffffffffffc0 = 0;
        local_58._0_4_ = 0;
        local_58._4_4_ = 0;
        local_58._8_4_ = 0;
        local_58._12_4_ = 0;
        local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(uVar16 + num_transactions);
        other = &CScript::operator<<((CScript *)local_58,(CScriptNum *)&local_228)->
                 super_CScriptBase;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,other);
        if (0x1c < uStack_3c) {
          free((void *)CONCAT44(local_58._4_4_,local_58._0_4_));
        }
        std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long_const&,CScript&>
                  ((vector<CTxOut,std::allocator<CTxOut>> *)&local_1f8,(long *)&local_218,
                   (CScript *)local_168);
        if (0x1c < (uint)_Stack_150._4_4_) {
          free((void *)local_168._0_8_);
        }
        uVar16 = uVar16 + 1;
      } while (uVar1 != uVar16);
      local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
                (&local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(CTransaction **)&local_228,(allocator<CTransaction> *)local_168,
                 (CMutableTransaction *)local_210);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::push_back(__return_storage_ptr__,&local_228);
      if (3000 < (long)local_218) {
        uVar9 = 0;
        do {
          local_168._0_8_ =
               *(undefined8 *)
                ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          local_168._8_8_ =
               *(undefined8 *)
                (((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          local_168._16_8_ =
               *(undefined8 *)
                (((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          _Stack_150._0_8_ =
               *(undefined8 *)
                (((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
          _Stack_150._M_parent._0_4_ = (uint32_t)uVar9;
          std::deque<std::pair<COutPoint,long>,std::allocator<std::pair<COutPoint,long>>>::
          emplace_back<COutPoint,long_const&>
                    ((deque<std::pair<COutPoint,long>,std::allocator<std::pair<COutPoint,long>>> *)
                     &local_1d8,(COutPoint *)local_168,(long *)&local_218);
          ppVar17 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first == 0) {
            ppVar17 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
          }
          uVar16 = (((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last -
                     (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) *
                    -0x5555555555555555 +
                   ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) *
                   -0x5555555555555555 +
                   (((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                   (ulong)(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                          (_Map_pointer)0x0)) * 10) - 1;
          if (uVar16 == 0) {
            uVar7 = 0x40;
          }
          else {
            lVar18 = 0x3f;
            if (uVar16 != 0) {
              for (; uVar16 >> lVar18 == 0; lVar18 = lVar18 + -1) {
              }
            }
            uVar7 = (uint)lVar18 ^ 0x3f;
          }
          do {
            uVar10 = RandomMixin<FastRandomContext>::randbits
                               (&det_rand->super_RandomMixin<FastRandomContext>,0x40 - uVar7);
          } while (uVar16 < uVar10);
          uVar16 = ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_first >> 4) *
                   -0x5555555555555555 + uVar10;
          if ((long)uVar16 < 0) {
            uVar12 = ~(~uVar16 / 10);
LAB_0083884d:
            ppVar11 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node[uVar12] +
                      uVar12 * -10;
            ppVar13 = (_Elt_pointer)(uVar16 * 0x30);
          }
          else {
            if (9 < uVar16) {
              uVar12 = uVar16 / 10;
              goto LAB_0083884d;
            }
            ppVar11 = (pair<COutPoint,_long> *)(uVar10 * 0x30);
            ppVar13 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
          }
          puVar14 = (ppVar13->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                    (long)&(ppVar11->first).hash.m_wrapped.super_base_blob<256U>;
          _Stack_150._M_parent._0_4_ = ppVar17[-1].first.n;
          local_168._0_8_ =
               *(undefined8 *)ppVar17[-1].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
          ;
          local_168._8_8_ =
               *(undefined8 *)
                (ppVar17[-1].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          local_168._16_8_ =
               *(undefined8 *)
                (ppVar17[-1].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          _Stack_150._0_8_ =
               *(undefined8 *)
                (ppVar17[-1].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
          ppVar17[-1].first.n = *(uint32_t *)(puVar14 + 0x20);
          uVar4 = *(undefined8 *)puVar14;
          uVar5 = *(undefined8 *)(puVar14 + 8);
          uVar6 = *(undefined8 *)(puVar14 + 0x18);
          *(undefined8 *)
           (ppVar17[-1].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
               *(undefined8 *)(puVar14 + 0x10);
          *(undefined8 *)
           (ppVar17[-1].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar6;
          *(undefined8 *)ppVar17[-1].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
               uVar4;
          *(undefined8 *)
           (ppVar17[-1].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar5;
          *(uint32_t *)(puVar14 + 0x20) = (uint32_t)_Stack_150._M_parent;
          *(undefined8 *)(puVar14 + 0x10) = local_168._16_8_;
          *(undefined8 *)(puVar14 + 0x18) = _Stack_150._0_8_;
          *(undefined8 *)puVar14 = local_168._0_8_;
          *(undefined8 *)(puVar14 + 8) = local_168._8_8_;
          lVar18 = ppVar17[-1].second;
          ppVar17[-1].second = *(long *)(puVar14 + 0x28);
          *(long *)(puVar14 + 0x28) = lVar18;
          bVar20 = uVar9 != uVar8;
          uVar9 = uVar9 + 1;
        } while (bVar20);
      }
      if (submit) {
        local_178._M_device = &cs_main.super_recursive_mutex;
        local_178._M_owns = false;
        std::unique_lock<std::recursive_mutex>::lock(&local_178);
        local_188._M_device =
             &(((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>.
                _M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl)->cs).super_recursive_mutex;
        local_188._M_owns = false;
        std::unique_lock<std::recursive_mutex>::lock(&local_188);
        local_58._4_4_ = 0;
        local_58._8_4_ = 0;
        local_58._12_4_ = 0;
        local_58._16_4_ = 0;
        this_00 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                  mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>.
                  _M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
        CTxMemPoolEntry::CTxMemPoolEntry
                  ((CTxMemPoolEntry *)local_168,&local_228,lVar15 - local_218 * uVar1,0,1,0,false,4,
                   (LockPoints)(ZEXT424((uint)local_58._0_4_) << 0x20));
        CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
        std::
        _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
        ::~_Rb_tree(local_128);
        std::
        _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
        ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                     *)(local_168 + 0x10));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&local_188);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&local_178);
      }
      if (local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      num_transactions = num_transactions - 1;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_1f8);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_210);
    } while (num_transactions != 0);
  }
  std::_Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>::
  ~_Deque_base(&local_1d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CTransactionRef> TestChain100Setup::PopulateMempool(FastRandomContext& det_rand, size_t num_transactions, bool submit)
{
    std::vector<CTransactionRef> mempool_transactions;
    std::deque<std::pair<COutPoint, CAmount>> unspent_prevouts;
    std::transform(m_coinbase_txns.begin(), m_coinbase_txns.end(), std::back_inserter(unspent_prevouts),
        [](const auto& tx){ return std::make_pair(COutPoint(tx->GetHash(), 0), tx->vout[0].nValue); });
    while (num_transactions > 0 && !unspent_prevouts.empty()) {
        // The number of inputs and outputs are random, between 1 and 24.
        CMutableTransaction mtx = CMutableTransaction();
        const size_t num_inputs = det_rand.randrange(24) + 1;
        CAmount total_in{0};
        for (size_t n{0}; n < num_inputs; ++n) {
            if (unspent_prevouts.empty()) break;
            const auto& [prevout, amount] = unspent_prevouts.front();
            mtx.vin.emplace_back(prevout, CScript());
            total_in += amount;
            unspent_prevouts.pop_front();
        }
        const size_t num_outputs = det_rand.randrange(24) + 1;
        const CAmount fee = 100 * det_rand.randrange(30);
        const CAmount amount_per_output = (total_in - fee) / num_outputs;
        for (size_t n{0}; n < num_outputs; ++n) {
            CScript spk = CScript() << CScriptNum(num_transactions + n);
            mtx.vout.emplace_back(amount_per_output, spk);
        }
        CTransactionRef ptx = MakeTransactionRef(mtx);
        mempool_transactions.push_back(ptx);
        if (amount_per_output > 3000) {
            // If the value is high enough to fund another transaction + fees, keep track of it so
            // it can be used to build a more complex transaction graph. Insert randomly into
            // unspent_prevouts for extra randomness in the resulting structures.
            for (size_t n{0}; n < num_outputs; ++n) {
                unspent_prevouts.emplace_back(COutPoint(ptx->GetHash(), n), amount_per_output);
                std::swap(unspent_prevouts.back(), unspent_prevouts[det_rand.randrange(unspent_prevouts.size())]);
            }
        }
        if (submit) {
            LOCK2(cs_main, m_node.mempool->cs);
            LockPoints lp;
            m_node.mempool->addUnchecked(CTxMemPoolEntry(ptx, /*fee=*/(total_in - num_outputs * amount_per_output),
                                                         /*time=*/0, /*entry_height=*/1, /*entry_sequence=*/0,
                                                         /*spends_coinbase=*/false, /*sigops_cost=*/4, lp));
        }
        --num_transactions;
    }
    return mempool_transactions;
}